

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

thread * __thiscall jessilib::thread_pool::inactive_thread(thread_pool *this)

{
  _Elt_pointer pptVar1;
  int iVar2;
  thread *ptVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_inactive_threads_mutex);
  if (iVar2 == 0) {
    pptVar1 = (this->m_inactive_threads).c.
              super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_inactive_threads).c.
        super__Deque_base<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == pptVar1) {
      ptVar3 = (thread *)0x0;
    }
    else {
      ptVar3 = *pptVar1;
      std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>
      ::pop_front(&(this->m_inactive_threads).c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_inactive_threads_mutex);
    return ptVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

thread_pool::thread* thread_pool::inactive_thread() {
	std::lock_guard<std::mutex> guard(m_inactive_threads_mutex);

	if (!m_inactive_threads.empty()) {
		thread* result = m_inactive_threads.front();
		m_inactive_threads.pop();
		return result;
	}

	return nullptr;
}